

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O0

void USPE_seasonal(double *inp,int N,int s,int p,int q,double *phi,double *theta)

{
  int M;
  double *acov;
  void *__ptr;
  double *A_00;
  double *b_00;
  int *ipiv_00;
  double *__ptr_00;
  undefined8 *__ptr_01;
  double *array;
  double *__ptr_02;
  double *x_00;
  double *A_01;
  int *ipiv_01;
  double dVar1;
  int *ipiv2;
  int *ipiv;
  double *cv;
  double *h;
  double *T;
  double *tau;
  double *f;
  double *x;
  double *c2;
  double *A;
  double *c;
  double *b;
  double epsilon;
  double tempd;
  int local_40;
  int it1;
  int temp;
  int t;
  int l;
  int j;
  int i;
  int K;
  double *phi_local;
  int q_local;
  int p_local;
  int s_local;
  int N_local;
  double *inp_local;
  
  M = (p + q + 1) * s;
  acov = (double *)malloc((long)M << 3);
  __ptr = malloc((long)(p + q + 1) << 3);
  A_00 = (double *)malloc((long)p * 8 * (long)p);
  b_00 = (double *)malloc((long)p << 3);
  ipiv_00 = (int *)malloc((long)p << 2);
  __ptr_00 = (double *)malloc((long)(q + 1) << 3);
  __ptr_01 = (undefined8 *)malloc((long)(p + 1) << 3);
  array = (double *)malloc((long)(q + 1) << 3);
  __ptr_02 = (double *)malloc((long)(q + 1) << 3);
  x_00 = (double *)malloc((long)(q + 1) << 3);
  A_01 = (double *)malloc((long)(q + 1) * 8 * (long)(q + 1));
  ipiv_01 = (int *)malloc((long)(q + 1) << 2);
  autocovar(inp,N,acov,M);
  for (l = 0; l < p + q + 1; l = l + 1) {
    *(double *)((long)__ptr + (long)l * 8) = acov[l * s];
  }
  *__ptr_01 = 0xbff0000000000000;
  for (l = 0; l < p; l = l + 1) {
    phi[l] = 0.0;
  }
  for (l = 0; l < q; l = l + 1) {
    theta[l] = 0.0;
  }
  if (0 < p) {
    for (l = 1; l <= p; l = l + 1) {
      for (t = 1; t <= p; t = t + 1) {
        local_40 = (q + l) - t;
        if (local_40 < 0) {
          local_40 = -local_40;
        }
        A_00[(l + -1) * p + t + -1] = *(double *)((long)__ptr + (long)local_40 * 8);
      }
    }
    for (l = 0; l < p; l = l + 1) {
      b_00[l] = *(double *)((long)__ptr + (long)(q + l + 1) * 8);
    }
    ludecomp(A_00,p,ipiv_00);
    linsolve(A_00,p,b_00,ipiv_00,phi);
  }
  for (l = 0; l < p; l = l + 1) {
    __ptr_01[l + 1] = phi[l];
  }
  if (p == 0) {
    for (l = 0; l < q + 1; l = l + 1) {
      __ptr_00[l] = *(double *)((long)__ptr + (long)l * 8);
    }
  }
  else {
    for (t = 0; t < q + 1; t = t + 1) {
      epsilon = 0.0;
      for (l = 0; l < p + 1; l = l + 1) {
        for (temp = 0; temp < p + 1; temp = temp + 1) {
          local_40 = (t + l) - temp;
          if (local_40 < 0) {
            local_40 = -local_40;
          }
          epsilon = (double)__ptr_01[l] * (double)__ptr_01[temp] *
                    *(double *)((long)__ptr + (long)local_40 * 8) + epsilon;
        }
      }
      __ptr_00[t] = epsilon;
    }
  }
  for (l = 0; l <= q; l = l + 1) {
    __ptr_02[l] = 0.0;
    array[l] = 0.0;
  }
  dVar1 = sqrt(*__ptr_00);
  *__ptr_02 = dVar1;
  for (t = 0; t <= q; t = t + 1) {
    for (l = 0; l < (q - t) + 1; l = l + 1) {
      array[t] = __ptr_02[l] * __ptr_02[l + t] + array[t];
    }
    array[t] = array[t] - __ptr_00[t];
  }
  tempd._4_4_ = 0;
  while (dVar1 = array_max_abs(array,q + 1), 0.0001 < dVar1 && tempd._4_4_ < 200) {
    tempd._4_4_ = tempd._4_4_ + 1;
    for (l = 0; l < q + 1; l = l + 1) {
      for (t = 0; t < q + 1; t = t + 1) {
        epsilon = 0.0;
        if (l + t <= q) {
          epsilon = __ptr_02[l + t] + 0.0;
        }
        if (-1 < t - l) {
          epsilon = epsilon + __ptr_02[t - l];
        }
        A_01[l * (q + 1) + t] = epsilon;
      }
    }
    ludecomp(A_01,q + 1,ipiv_01);
    linsolve(A_01,q + 1,array,ipiv_01,x_00);
    for (l = 0; l < q + 1; l = l + 1) {
      __ptr_02[l] = __ptr_02[l] - x_00[l];
      array[l] = 0.0;
    }
    for (t = 0; t < q + 1; t = t + 1) {
      for (l = 0; l < (q - t) + 1; l = l + 1) {
        array[t] = __ptr_02[l] * __ptr_02[l + t] + array[t];
      }
      array[t] = array[t] - __ptr_00[t];
    }
  }
  for (t = 1; t < q + 1; t = t + 1) {
    theta[t + -1] = (__ptr_02[t] * -1.0) / *__ptr_02;
  }
  free(__ptr);
  free(acov);
  free(A_00);
  free(b_00);
  free(ipiv_00);
  free(__ptr_00);
  free(__ptr_01);
  free(array);
  free(__ptr_02);
  free(A_01);
  free(ipiv_01);
  free(x_00);
  return;
}

Assistant:

void USPE_seasonal(double *inp,int N,int s,int p, int q, double *phi,double *theta) {
	int K,i,j,l,t,temp,it1;
	double tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h,*cv;
	int *ipiv,*ipiv2;

	K = (p + q + 1) * s;

	cv = (double *) malloc(sizeof(double) * K);
	c = (double *) malloc(sizeof(double) * (p+q+1));
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,cv,K);
	for(i = 0; i < p+q+1;++i) {
		c[i] = cv[i*s];
	}

	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}


	free(c);
	free(cv);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);

}